

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strfuncs.c
# Opt level: O2

int32 str2words(char *line,char **ptr,int32 max_ptr)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  lVar1 = 0;
  uVar2 = 0;
LAB_0010812a:
  uVar3 = (ulong)(int)uVar2;
  uVar2 = uVar3;
  while( true ) {
    uVar2 = uVar2 + 1;
    uVar4 = (ulong)(byte)line[uVar3];
    if (0x20 < uVar4) break;
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0) goto LAB_001081b4;
      break;
    }
    uVar3 = uVar3 + 1;
  }
  if (max_ptr <= lVar1 && ptr != (char **)0x0) {
    lVar1 = -1;
    for (; -1 < (int)uVar3; uVar3 = (ulong)((int)uVar3 - 1)) {
      if (line[uVar3 & 0xffffffff] == '\0') {
        line[uVar3 & 0xffffffff] = ' ';
      }
    }
LAB_001081b4:
    return (int32)lVar1;
  }
  if (ptr != (char **)0x0) {
    ptr[lVar1] = line + uVar3;
  }
  lVar1 = lVar1 + 1;
  do {
    uVar3 = (ulong)(byte)line[uVar2 - 1];
    if (uVar3 < 0x21) {
      if ((0x100002600U >> (uVar3 & 0x3f) & 1) != 0) break;
      if (uVar3 == 0) goto LAB_001081b4;
    }
    uVar2 = uVar2 + 1;
  } while( true );
  if (ptr != (char **)0x0) {
    line[uVar2 - 1] = '\0';
  }
  goto LAB_0010812a;
}

Assistant:

int32
str2words(char *line, char **ptr, int32 max_ptr)
{
    int32 i, n;

    n = 0;                      /* #words found so far */
    i = 0;                      /* For scanning through the input string */
    while (1) {
        /* Skip whitespace before next word */
        while (line[i] && isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;

        if (ptr != NULL && n >= max_ptr) {
            /*
             * Pointer array size insufficient.  Restore NULL chars inserted so far
             * to space chars.  Not a perfect restoration, but better than nothing.
             */
            for (; i >= 0; --i)
                if (line[i] == '\0')
                    line[i] = ' ';

            return -1;
        }

        /* Scan to end of word */
        if (ptr != NULL)
            ptr[n] = line + i;
        ++n;
        while (line[i] && !isspace_c(line[i]))
            ++i;
        if (!line[i])
            break;
        if (ptr != NULL)
            line[i] = '\0';
        ++i;
    }

    return n;
}